

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMatcherTestCase.cpp
# Opt level: O0

void __thiscall TestmatchPricePriority::~TestmatchPricePriority(TestmatchPricePriority *this)

{
  TestmatchPricePriority *this_local;
  
  ~TestmatchPricePriority(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST( matchPricePriority )
{  
  OrderMatcher object;
  Order order1("1", "LNUX", "OWNER1", "TARGET",
               Order::sell, Order::limit, 12.32, 50);
  Order order2("2", "LNUX", "OWNER2", "TARGET",
               Order::sell, Order::limit, 12.31, 50);
  Order order3("3", "LNUX", "OWNER3", "TARGET",
               Order::buy, Order::limit, 12.32, 50);

  CHECK(object.insert(order1));
  CHECK(object.insert(order2));

  std::queue<Order> orders;
  CHECK(!object.match("LNUX", orders));
  CHECK_EQUAL(0U, orders.size());

  CHECK(object.insert(order3));

  CHECK(object.match("LNUX", orders));
  CHECK_EQUAL(2U, orders.size());

  Order matchedOrder3 = orders.front();
  orders.pop();
  Order matchedOrder2 = orders.front();
  orders.pop();

  CHECK_EQUAL("2", matchedOrder2.getClientID());
  CHECK_EQUAL("3", matchedOrder3.getClientID());
}